

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS TestNestedTooDeep(void)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  WJTL_STATUS WVar4;
  JL_STATUS JVar5;
  JL_STATUS JVar6;
  WJTL_STATUS WVar7;
  JL_STATUS JVar8;
  JL_STATUS JVar9;
  WJTL_STATUS WVar10;
  JL_STATUS JVar11;
  WJTL_STATUS WVar12;
  bool Condition;
  JlDataObject *objectTree;
  WJTL_STATUS local_40;
  JL_STATUS local_3c;
  char *local_38;
  
  local_38 = (char *)0x0;
  objectTree = (JlDataObject *)0x0;
  WVar4 = GenerateNestedJsonList(0x40,&local_38);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonList( 64, &jsonText ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4ba);
  pcVar3 = local_38;
  JVar5 = JlParseJson(local_38,&objectTree,(size_t *)0x0);
  WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJson( jsonText, &objectTree, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4bb);
  local_3c = JlFreeObjectTree(&objectTree);
  WjTestLib_Assert(local_3c == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4bc);
  WjTestLib_Free(pcVar3);
  local_38 = (char *)0x0;
  local_40 = GenerateNestedJsonList(0x41,&local_38);
  WjTestLib_Assert(local_40 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonList( 64+1, &jsonText ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4c1);
  pcVar3 = local_38;
  JVar6 = JlParseJson(local_38,&objectTree,(size_t *)0x0);
  WjTestLib_Assert(JVar6 == JL_STATUS_JSON_NESTING_TOO_DEEP,
                   "(JlParseJson( jsonText, &objectTree, ((void*)0) )) == (JL_STATUS_JSON_NESTING_TOO_DEEP)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4c2);
  Condition = objectTree == (JlDataObject *)0x0;
  WjTestLib_Assert(Condition,"(objectTree) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4c3);
  WjTestLib_Free(pcVar3);
  local_38 = (char *)0x0;
  WVar7 = GenerateNestedJsonDictionary(0x40,&local_38);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonDictionary( 64, &jsonText ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4ca);
  pcVar3 = local_38;
  JVar8 = JlParseJson(local_38,&objectTree,(size_t *)0x0);
  WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJson( jsonText, &objectTree, ((void*)0) ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4cb);
  bVar2 = local_3c != JL_STATUS_SUCCESS;
  bVar1 = local_40 != WJTL_STATUS_SUCCESS;
  JVar9 = JlFreeObjectTree(&objectTree);
  WjTestLib_Assert(JVar9 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4cc);
  WjTestLib_Free(pcVar3);
  local_38 = (char *)0x0;
  WVar10 = GenerateNestedJsonDictionary(0x41,&local_38);
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(GenerateNestedJsonDictionary( 64+1, &jsonText ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4d1);
  pcVar3 = local_38;
  JVar11 = JlParseJson(local_38,&objectTree,(size_t *)0x0);
  WjTestLib_Assert(JVar11 == JL_STATUS_JSON_NESTING_TOO_DEEP,
                   "(JlParseJson( jsonText, &objectTree, ((void*)0) )) == (JL_STATUS_JSON_NESTING_TOO_DEEP)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4d2);
  WVar12 = WJTL_STATUS_SUCCESS;
  if ((!Condition || JVar6 != JL_STATUS_JSON_NESTING_TOO_DEEP) ||
      (((((WVar4 != WJTL_STATUS_SUCCESS || bVar2) || bVar1) || WVar7 != WJTL_STATUS_SUCCESS) ||
       JVar5 != JL_STATUS_SUCCESS) || JVar8 != JL_STATUS_SUCCESS)) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (objectTree != (JlDataObject *)0x0) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  if (JVar11 != JL_STATUS_JSON_NESTING_TOO_DEEP) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(objectTree == (JlDataObject *)0x0,"(objectTree) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestNestedTooDeep",0x4d3);
  if (WVar10 != WJTL_STATUS_SUCCESS || JVar9 != JL_STATUS_SUCCESS) {
    WVar12 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(pcVar3);
  return WVar12;
}

Assistant:

static
WJTL_STATUS
    TestNestedTooDeep
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    char* jsonText = NULL;
    JlDataObject* objectTree = NULL;

    // Test deep lists

    // Check MAX_JSON_DEPTH levels - The max amount that will work
    JL_ASSERT_SUCCESS( GenerateNestedJsonList( MAX_JSON_DEPTH, &jsonText ) );
    JL_ASSERT_SUCCESS( JlParseJson( jsonText, &objectTree, NULL ) );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JlFree( jsonText );
    jsonText = NULL;

    // Check one greater than MAX_JSON_DEPTH levels - This should fail. Make sure there is no memory leak
    JL_ASSERT_SUCCESS( GenerateNestedJsonList( MAX_JSON_DEPTH+1, &jsonText ) );
    JL_ASSERT_STATUS( JlParseJson( jsonText, &objectTree, NULL ), JL_STATUS_JSON_NESTING_TOO_DEEP );
    JL_ASSERT_NULL( objectTree );
    JlFree( jsonText );
    jsonText = NULL;

    // Now test dictionaries that are nested deeply

    // Check MAX_JSON_DEPTH level - the max amount that will work
    JL_ASSERT_SUCCESS( GenerateNestedJsonDictionary( MAX_JSON_DEPTH, &jsonText ) );
    JL_ASSERT_SUCCESS( JlParseJson( jsonText, &objectTree, NULL ) );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JlFree( jsonText );
    jsonText = NULL;

    // Check one greater than MAX_JSON_DEPTH levels - This should fail. Make sure there is no memory leak
    JL_ASSERT_SUCCESS( GenerateNestedJsonDictionary( MAX_JSON_DEPTH+1, &jsonText ) );
    JL_ASSERT_STATUS( JlParseJson( jsonText, &objectTree, NULL ), JL_STATUS_JSON_NESTING_TOO_DEEP );
    JL_ASSERT_NULL( objectTree );
    JlFree( jsonText );
    jsonText = NULL;

    return TestReturn;
}